

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamfortestoutput.h
# Opt level: O0

char UnitTests::escape_it(char c)

{
  char local_9;
  char c_local;
  
  switch(c) {
  case '\t':
    local_9 = 't';
    break;
  case '\n':
    local_9 = 'n';
    break;
  case '\v':
    local_9 = 'v';
    break;
  default:
    local_9 = c;
    break;
  case '\r':
    local_9 = 'r';
  }
  return local_9;
}

Assistant:

inline char escape_it(char c)
    {
        switch (c)
        {
            case '\n':
                return 'n';
            case '\t':
                return 't';
            case '\r':
                return 'r';
            case '\v':
                return 'v';
            default:
                return c;
        }
    }